

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

mp_limb_t mpn_neg(mp_ptr rp,mp_srcptr up,mp_size_t n)

{
  long local_28;
  mp_size_t n_local;
  mp_srcptr up_local;
  mp_ptr rp_local;
  
  local_28 = n;
  n_local = (mp_size_t)up;
  up_local = rp;
  while( true ) {
    if (*(long *)n_local != 0) {
      *up_local = -*(long *)n_local;
      mpn_com(up_local + 1,(mp_srcptr)(n_local + 8),local_28 + -1);
      return 1;
    }
    *up_local = 0;
    local_28 = local_28 + -1;
    if (local_28 == 0) break;
    n_local = n_local + 8;
    up_local = up_local + 1;
  }
  return 0;
}

Assistant:

mp_limb_t
mpn_neg (mp_ptr rp, mp_srcptr up, mp_size_t n)
{
  while (*up == 0)
    {
      *rp = 0;
      if (!--n)
	return 0;
      ++up; ++rp;
    }
  *rp = - *up;
  mpn_com (++rp, ++up, --n);
  return 1;
}